

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::PrettyUnitTestResultPrinter::PrintSkippedTests(UnitTest *unit_test)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  TestSuite *this;
  TestInfo *pTVar4;
  int j;
  int i;
  
  iVar2 = UnitTest::skipped_test_count(unit_test);
  if (iVar2 != 0) {
    for (iVar2 = 0;
        iVar2 < (int)((ulong)((long)(unit_test->impl_->test_suites_).
                                    super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(unit_test->impl_->test_suites_).
                                   super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
        iVar2 = iVar2 + 1) {
      this = UnitTest::GetTestSuite(unit_test,iVar2);
      if (this->should_run_ == true) {
        iVar3 = TestSuite::skipped_test_count(this);
        if (iVar3 != 0) {
          for (iVar3 = 0;
              iVar3 < (int)((ulong)((long)(this->test_info_list_).
                                          super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->test_info_list_).
                                         super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3);
              iVar3 = iVar3 + 1) {
            pTVar4 = TestSuite::GetTestInfo(this,iVar3);
            if (pTVar4->should_run_ == true) {
              bVar1 = TestResult::Skipped(&pTVar4->result_);
              if (bVar1) {
                ColoredPrintf(COLOR_GREEN,"[  SKIPPED ] ");
                printf("%s.%s",(this->name_)._M_dataplus._M_p,(pTVar4->name_)._M_dataplus._M_p);
                putchar(10);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::PrintSkippedTests(const UnitTest& unit_test) {
  const int skipped_test_count = unit_test.skipped_test_count();
  if (skipped_test_count == 0) {
    return;
  }

  for (int i = 0; i < unit_test.total_test_suite_count(); ++i) {
    const TestSuite& test_suite = *unit_test.GetTestSuite(i);
    if (!test_suite.should_run() || (test_suite.skipped_test_count() == 0)) {
      continue;
    }
    for (int j = 0; j < test_suite.total_test_count(); ++j) {
      const TestInfo& test_info = *test_suite.GetTestInfo(j);
      if (!test_info.should_run() || !test_info.result()->Skipped()) {
        continue;
      }
      ColoredPrintf(COLOR_GREEN, "[  SKIPPED ] ");
      printf("%s.%s", test_suite.name(), test_info.name());
      printf("\n");
    }
  }
}